

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O2

void __thiscall R_class::ID_exe(R_class *this,memory *MEM,uint *reg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = (this->super_order).code[0];
  iVar1 = (this->super_order).code[1];
  this->func7 = iVar3 >> 1;
  iVar2 = (this->super_order).code[2];
  this->func3 = (iVar2 >> 4) % 8;
  iVar4 = (iVar2 >> 7) + (iVar1 % 0x10) * 2;
  this->rs_id1 = iVar4;
  iVar3 = (iVar3 % 2) * 0x10 + (iVar1 >> 4);
  this->rs_id2 = iVar3;
  this->rs_data1 = reg[iVar4];
  this->rs_data2 = reg[iVar3];
  this->rd_id = ((this->super_order).code[3] >> 7) + (iVar2 % 0x10) * 2;
  return;
}

Assistant:

void R_class::ID_exe(memory &MEM,unsigned int *reg) {
    func7=code[0]>>1;
    func3=(code[2]>>4)%8;
    rs_id1=((code[1]%16)<<1)+(code[2]>>7);
    rs_id2=(code[1]>>4)+((code[0]%2)<<4);
    rs_data1=reg[rs_id1];
    rs_data2=reg[rs_id2];
    rd_id=((code[2]%16)<<1)+(code[3]>>7);
}